

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O3

bool __thiscall diy::Master::Proxy::fill_incoming(Proxy *this)

{
  IExchangeInfo *pIVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>
  _Var3;
  mapped_type *this_00;
  mapped_type *this_01;
  bool bVar4;
  _Rb_tree_header *p_Var5;
  iterator __begin2;
  unique_lock<tthread::fast_mutex> local_58;
  iterator local_48;
  
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
  ::clear(&(this->incoming_)._M_t);
  local_48.it._M_node._0_4_ = this->gid_;
  this_00 = std::
            map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
            ::operator[](&this->master_->incoming_,&this->master_->exchange_round_);
  this_01 = std::
            map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
            ::operator[](&this_00->map,(key_type *)&local_48);
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  ::begin(&local_48,this_01);
  p_Var5 = &(this_01->map_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_48.it._M_node == p_Var5) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      _Var3._M_node = local_48.it._M_node;
      p_Var2 = local_48.it._M_node + 1;
      local_58._M_device = (mutex_type *)&local_48.it._M_node[3]._M_right;
      local_58._M_owns = false;
      std::unique_lock<tthread::fast_mutex>::lock(&local_58);
      local_58._M_owns = true;
      if (_Var3._M_node[2]._M_right != _Var3._M_node[1]._M_right) {
        std::
        _Rb_tree<int,std::pair<int_const,diy::MemoryBuffer>,std::_Select1st<std::pair<int_const,diy::MemoryBuffer>>,std::less<int>,std::allocator<std::pair<int_const,diy::MemoryBuffer>>>
        ::_M_emplace_unique<int_const&,diy::MemoryBuffer>
                  ((_Rb_tree<int,std::pair<int_const,diy::MemoryBuffer>,std::_Select1st<std::pair<int_const,diy::MemoryBuffer>>,std::less<int>,std::allocator<std::pair<int_const,diy::MemoryBuffer>>>
                    *)&this->incoming_,(int *)(_Var3._M_node + 1),
                   (MemoryBuffer *)&(_Var3._M_node[1]._M_right)->_M_left);
        std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::pop_front
                  ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *)
                   &p_Var2->_M_parent);
        pIVar1 = this->iexchange_;
        bVar4 = true;
        if (pIVar1 != (IExchangeInfo *)0x0) {
          (**(code **)(*(long *)pIVar1 + 0x18))(pIVar1,0xffffffff);
        }
      }
      if ((local_58._M_owns == true) && (local_58._M_device != (mutex_type *)0x0)) {
        LOCK();
        *local_58._M_device = 0;
        UNLOCK();
      }
      local_48.it._M_node = (_Base_ptr)std::_Rb_tree_increment(local_48.it._M_node);
    } while ((_Rb_tree_header *)local_48.it._M_node != p_Var5);
  }
  if (local_48.lock_ptr.
      super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.lock_ptr.
               super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar4;
}

Assistant:

bool                fill_incoming() const
    {
        bool exists = false;

        incoming_.clear();

        // fill incoming_
        for (auto& x : master_->incoming(gid_))
        {
            auto access = x.second.access();
            if (!access->empty())
            {
                exists = true;
                incoming_.emplace(x.first, access->front().move());
                access->pop_front();
                if (iexchange_)
                    iexchange_->dec_work();
            }
        }

        return exists;
    }